

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O0

void __thiscall Scs::Client::Client(Client *this,ClientParams *params)

{
  ClientParams *__t;
  string_view *__t_00;
  Allocator<char> local_2d [20];
  Allocator<char> local_19;
  ClientParams *local_18;
  ClientParams *params_local;
  Client *this_local;
  
  local_18 = params;
  params_local = (ClientParams *)this;
  IClient::IClient(&this->super_IClient);
  (this->super_IClient)._vptr_IClient = (_func_int **)&PTR__Client_001297f0;
  std::shared_ptr<Scs::Socket>::shared_ptr(&this->m_socket);
  std::thread::thread(&this->m_thread);
  std::function<void_(Scs::IClient_&)>::function(&this->m_onConnect);
  std::function<void_(Scs::IClient_&)>::function(&this->m_onDisconnect);
  std::function<void_(Scs::IClient_&,_const_void_*,_unsigned_long)>::function
            (&this->m_onReceiveData);
  std::function<void_(Scs::IClient_&)>::function(&this->m_onUpdate);
  __t = local_18;
  Allocator<char>::Allocator(&local_19);
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  basic_string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_port,
             &__t->port,&local_19);
  Allocator<char>::~Allocator(&local_19);
  __t_00 = &local_18->address;
  Allocator<char>::Allocator(local_2d);
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  basic_string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_address,
             __t_00,local_2d);
  Allocator<char>::~Allocator(local_2d);
  this->m_timeoutMs = (long)(local_18->timeoutSeconds * 1000.0);
  std::atomic<Scs::Client::Status>::atomic(&this->m_status,Initial);
  std::atomic<bool>::atomic(&this->m_error,false);
  SendQueue::SendQueue(&this->m_sendQueue);
  return;
}

Assistant:

Client::Client(const ClientParams & params) :
	m_port(params.port),
	m_address(params.address),
	m_timeoutMs(static_cast<long long>(params.timeoutSeconds * 1000.0))
{
}